

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::GetGeneratorDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  pointer ppcVar4;
  cmDocumentationEntry e;
  cmDocumentationEntry local_70;
  
  paVar1 = &local_70.Name.field_2;
  for (ppcVar4 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar4 !=
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
    local_70.Name._M_string_length = 0;
    local_70.Name.field_2._M_local_buf[0] = '\0';
    local_70.Brief._M_dataplus._M_p = (pointer)&local_70.Brief.field_2;
    local_70.Brief._M_string_length = 0;
    local_70.Brief.field_2._M_local_buf[0] = '\0';
    local_70.Name._M_dataplus._M_p = (pointer)paVar1;
    (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar4,&local_70);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back(v,&local_70)
    ;
    cmDocumentationEntry::~cmDocumentationEntry(&local_70);
  }
  for (p_Var3 = (this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_70.Name._M_string_length = 0;
    local_70.Name.field_2._M_local_buf[0] = '\0';
    local_70.Brief._M_dataplus._M_p = (pointer)&local_70.Brief.field_2;
    local_70.Brief._M_string_length = 0;
    local_70.Brief.field_2._M_local_buf[0] = '\0';
    local_70.Name._M_dataplus._M_p = (pointer)paVar1;
    plVar2 = (long *)(**(code **)(p_Var3 + 2))();
    (**(code **)(*plVar2 + 0x18))(plVar2,&local_70,p_Var3 + 1);
    std::__cxx11::string::_M_assign((string *)&local_70);
    (**(code **)(*plVar2 + 8))(plVar2);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back(v,&local_70)
    ;
    cmDocumentationEntry::~cmDocumentationEntry(&local_70);
  }
  return;
}

Assistant:

void cmake::GetGeneratorDocumentation(std::vector<cmDocumentationEntry>& v)
{
  for(RegisteredGeneratorsVector::const_iterator i =
      this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    cmDocumentationEntry e;
    (*i)->GetDocumentation(e);
    v.push_back(e);
    }
  for(RegisteredExtraGeneratorsMap::const_iterator i =
      this->ExtraGenerators.begin(); i != this->ExtraGenerators.end(); ++i)
    {
    cmDocumentationEntry e;
    cmExternalMakefileProjectGenerator* generator = (i->second)();
    generator->GetDocumentation(e, i->first);
    e.Name = i->first;
    delete generator;
    v.push_back(e);
    }
}